

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::computeFrhs1
          (SPxSolverBase<double> *this,VectorBase<double> *ufb,VectorBase<double> *lfb)

{
  double dVar1;
  Representation RVar2;
  Status SVar3;
  int iVar4;
  SVSetBase<double> *pSVar5;
  Status *pSVar6;
  pointer pdVar7;
  pointer pdVar8;
  VectorBase<double> *pVVar9;
  Item *pIVar10;
  undefined8 *puVar11;
  long lVar12;
  pointer pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  pSVar5 = this->thevectors;
  lVar12 = (long)(pSVar5->set).thenum;
  if (0 < lVar12) {
    pSVar6 = ((this->super_SPxBasisBase<double>).thedesc.stat)->data;
    RVar2 = this->theRep;
    pdVar7 = (lfb->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (ufb->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar9 = this->theFrhs;
    lVar14 = 0;
    do {
      SVar3 = pSVar6[lVar14];
      if (RVar2 * SVar3 < 1) {
        pdVar13 = pdVar8;
        switch(SVar3) {
        case P_FIXED:
        case P_ON_LOWER:
        case D_ON_LOWER:
        case D_ON_BOTH:
          pdVar13 = pdVar7;
        case P_ON_UPPER:
        case D_ON_UPPER:
          dVar1 = pdVar13[lVar14];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            pIVar10 = (pSVar5->set).theitem;
            iVar4 = (pSVar5->set).thekey[lVar14].idx;
            lVar16 = (long)pIVar10[iVar4].data.super_SVectorBase<double>.memused;
            if (0 < lVar16) {
              pdVar13 = (pVVar9->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar15 = lVar16 + 1;
              piVar17 = &pIVar10[iVar4].data.super_SVectorBase<double>.m_elem[lVar16 + -1].idx;
              do {
                pdVar13[*piVar17] =
                     pdVar13[*piVar17] - ((Nonzero<double> *)(piVar17 + -2))->val * dVar1;
                lVar15 = lVar15 + -1;
                piVar17 = piVar17 + -4;
              } while (1 < lVar15);
            }
          }
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ESVECS03 ERROR: ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"XSVECS04 This should never happen.","");
          *puVar11 = &PTR__SPxException_003af870;
          puVar11[1] = puVar11 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar11 + 1),local_48,local_48 + local_40);
          *puVar11 = &PTR__SPxException_003b0638;
          __cxa_throw(puVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_FREE:
        case D_FREE:
        case D_UNDEFINED:
          break;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar12);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}